

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O2

void Macro_smpsFade(uint arg_count,long *arg_array)

{
  uchar value;
  
  if (target_driver < 3) {
    value = 0xe4;
    if (((arg_count == 0) || (source_driver < 3)) || (*arg_array == 0xff)) goto LAB_00104037;
  }
  else {
    WriteByte(0xe2);
    if (arg_count != 0) {
      WriteByte((uchar)*arg_array);
    }
    value = 0xf2;
    if (source_driver < 3) {
LAB_00104037:
      WriteByte(value);
      return;
    }
  }
  return;
}

Assistant:

static void Macro_smpsFade(unsigned int arg_count, long arg_array[])
{
	if (target_driver >= 3)
	{
		WriteByte(0xE2);

		if (arg_count >= 1)
			WriteByte(arg_array[0]);

		if (source_driver < 3)
			Macro_smpsStop(arg_count, arg_array);
	}
	else if (source_driver >= 3 && arg_count >= 1 && arg_array[0] != 0xFF)
	{
		// We should ignore these (they're actually smpsNop commands)
	}
	else
	{
		WriteByte(0xE4);
	}
}